

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

void __thiscall
icu_63::CollationIterator::appendCEsFromCE32
          (CollationIterator *this,CollationData *d,UChar32 c,uint32_t ce32,UBool forward,
          UErrorCode *errorCode)

{
  CEBuffer *this_00;
  uint32_t *puVar1;
  UChar *pUVar2;
  long *plVar3;
  int64_t *piVar4;
  UBool UVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  
  if ((~ce32 & 0xc0) == 0) {
    this_00 = &this->ceBuffer;
    do {
      switch(ce32 & 0xf) {
      default:
        if (U_ZERO_ERROR < *errorCode) {
          return;
        }
        *errorCode = U_INTERNAL_PROGRAM_ERROR;
        return;
      case 1:
        if ((0x27 < (this->ceBuffer).length) &&
           (UVar5 = CEBuffer::ensureAppendCapacity(this_00,1,errorCode), UVar5 == '\0')) {
          return;
        }
        uVar13 = (ulong)(ce32 & 0xffffff00);
        goto LAB_00244ae6;
      case 2:
        if ((0x27 < (this->ceBuffer).length) &&
           (UVar5 = CEBuffer::ensureAppendCapacity(this_00,1,errorCode), UVar5 == '\0')) {
          return;
        }
        uVar13 = (ulong)(ce32 & 0xffffff00);
        goto LAB_00244af1;
      case 4:
        UVar5 = CEBuffer::ensureAppendCapacity(this_00,2,errorCode);
        if (UVar5 == '\0') {
          return;
        }
        iVar7 = (this->ceBuffer).length;
        plVar3 = (this->ceBuffer).buffer.ptr;
        plVar3[iVar7] = (CONCAT44(ce32,ce32 >> 8) & 0xff0000000000ff00) + 0x5000000;
        plVar3[(long)iVar7 + 1] = (ulong)((ce32 & 0xff00) << 0x10 | 0x500);
        (this->ceBuffer).length = iVar7 + 2;
        return;
      case 5:
        puVar1 = d->ce32s;
        uVar8 = ce32 >> 8 & 0x1f;
        UVar5 = CEBuffer::ensureAppendCapacity(this_00,uVar8,errorCode);
        if (UVar5 == '\0') {
          return;
        }
        iVar7 = (this->ceBuffer).length;
        plVar3 = (this->ceBuffer).buffer.ptr;
        iVar9 = uVar8 + 1;
        lVar11 = 0;
        do {
          uVar8 = puVar1[(ulong)(ce32 >> 0xd) + lVar11];
          if ((uVar8 & 0xff) < 0xc0) {
            uVar13 = (ulong)((uVar8 & 0xff) << 8) |
                     CONCAT44(uVar8,uVar8 << 0x10) & 0xffff0000ff000000;
          }
          else {
            uVar13 = (ulong)(uVar8 & 0xffffff00);
            if ((uVar8 & 0xf) == 1) {
              uVar13 = uVar13 << 0x20 | 0x5000500;
            }
          }
          this_00->length = iVar7 + 1 + (int)lVar11;
          plVar3[iVar7 + lVar11] = uVar13;
          lVar11 = lVar11 + 1;
          iVar9 = iVar9 + -1;
        } while (1 < iVar9);
        return;
      case 6:
        piVar4 = d->ces;
        uVar8 = ce32 >> 8 & 0x1f;
        UVar5 = CEBuffer::ensureAppendCapacity(this_00,uVar8,errorCode);
        if (UVar5 == '\0') {
          return;
        }
        iVar7 = (this->ceBuffer).length;
        plVar3 = (this->ceBuffer).buffer.ptr;
        iVar9 = uVar8 + 1;
        lVar11 = 0;
        do {
          plVar3[iVar7 + lVar11] = piVar4[(ulong)(ce32 >> 0xd) + lVar11];
          lVar11 = lVar11 + 1;
          iVar9 = iVar9 + -1;
        } while (1 < iVar9);
        this_00->length = iVar7 + (int)lVar11;
        return;
      case 7:
        uVar8 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)ce32,errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          return;
        }
        if (uVar8 == 0xc0) {
          d = this->data->base;
          uVar8 = CollationData::getCE32(d,c);
        }
        break;
      case 8:
        if (forward != '\0') {
          (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
        }
        uVar8 = getCE32FromPrefix(this,d,ce32,errorCode);
        if (forward != '\0') {
          (*(this->super_UObject)._vptr_UObject[0xc])(this,1,errorCode);
        }
        break;
      case 9:
        pUVar2 = d->contexts;
        uVar13 = (ulong)(ce32 >> 0xd);
        uVar8 = CONCAT22(pUVar2[uVar13],pUVar2[uVar13 + 1]);
        bVar14 = true;
        if (forward != '\0') {
          if ((this->skipped == (SkippedState *)0x0) && (this->numCpFwd < 0)) {
            uVar6 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
            if (-1 < (int)uVar6) {
              if ((ce32 >> 9 & 1) == 0) {
LAB_002446b2:
                uVar8 = nextCE32FromContraction
                                  (this,d,ce32,pUVar2 + uVar13 + 2,uVar8,uVar6,errorCode);
                bVar14 = uVar8 != 1;
                goto LAB_002448a7;
              }
              if (0x2ff < (int)uVar6) {
                uVar10 = (uVar6 >> 10) + 0xd7c0 & 0xffff;
                if ((int)uVar6 < 0x10000) {
                  uVar10 = uVar6;
                }
                if (((ulong)(byte)CollationFCD::lcccIndex[uVar10 >> 5] != 0) &&
                   ((*(uint *)(CollationFCD::lcccBits +
                              (ulong)(byte)CollationFCD::lcccIndex[uVar10 >> 5] * 4) >>
                     (uVar10 & 0x1f) & 1) != 0)) goto LAB_002446b2;
              }
              (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
            }
          }
          else {
            uVar6 = nextSkippedCodePoint(this,errorCode);
            if (-1 < (int)uVar6) {
              if ((ce32 >> 9 & 1) == 0) goto LAB_002446b2;
              if (0x2ff < (int)uVar6) {
                uVar10 = (uVar6 >> 10) + 0xd7c0 & 0xffff;
                if ((int)uVar6 < 0x10000) {
                  uVar10 = uVar6;
                }
                if (((ulong)(byte)CollationFCD::lcccIndex[uVar10 >> 5] != 0) &&
                   ((*(uint *)(CollationFCD::lcccBits +
                              (ulong)(byte)CollationFCD::lcccIndex[uVar10 >> 5] * 4) >>
                     (uVar10 & 0x1f) & 1) != 0)) goto LAB_002446b2;
              }
              backwardNumSkipped(this,1,errorCode);
            }
          }
          bVar14 = true;
        }
LAB_002448a7:
        if (!bVar14) {
          return;
        }
        break;
      case 10:
        if (this->isNumeric != '\0') {
          appendNumericCEs(this,ce32,forward,errorCode);
          return;
        }
        uVar8 = d->ce32s[ce32 >> 0xd];
        break;
      case 0xb:
        if ((forward != '\0') &&
           (iVar7 = (*(this->super_UObject)._vptr_UObject[10])(this), (char)iVar7 != '\0')) {
          if ((0x27 < (this->ceBuffer).length) &&
             (UVar5 = CEBuffer::ensureAppendCapacity(this_00,1,errorCode), UVar5 == '\0')) {
            return;
          }
          iVar7 = (this->ceBuffer).length;
          (this->ceBuffer).length = iVar7 + 1;
          (this->ceBuffer).buffer.ptr[iVar7] = 0x101000100;
          return;
        }
        uVar8 = *d->ce32s;
        break;
      case 0xc:
        puVar1 = d->jamoCE32s;
        iVar7 = c - 0xac00;
        iVar9 = (int)((ulong)((long)iVar7 * -0x6db6db6d) >> 0x20) + c + -0xac00;
        iVar9 = (iVar9 >> 4) - (iVar9 >> 0x1f);
        iVar12 = iVar7 + iVar9 * -0x1c;
        iVar9 = iVar9 % 0x15;
        c = iVar7 / 0x24c;
        if ((ce32 >> 8 & 1) == 0) {
          appendCEsFromCE32(this,d,-1,puVar1[c],forward,errorCode);
          appendCEsFromCE32(this,d,-1,puVar1[(long)iVar9 + 0x13],forward,errorCode);
          bVar14 = iVar12 == 0;
          if (!bVar14) {
            ce32 = puVar1[(long)iVar12 + 0x27];
            c = 0xffffffff;
          }
        }
        else {
          UVar5 = CEBuffer::ensureAppendCapacity(this_00,3 - (uint)(iVar12 == 0),errorCode);
          bVar14 = true;
          if (UVar5 != '\0') {
            uVar8 = puVar1[c];
            if ((uVar8 & 0xff) < 0xc0) {
              uVar13 = (ulong)((uVar8 & 0xff) << 8) |
                       CONCAT44(uVar8,uVar8 << 0x10) & 0xffff0000ff000000;
            }
            else {
              uVar13 = (ulong)(uVar8 & 0xffffff00);
              if ((uVar8 & 0xf) == 1) {
                uVar13 = uVar13 << 0x20 | 0x5000500;
              }
            }
            iVar7 = this_00->length;
            plVar3 = (this->ceBuffer).buffer.ptr;
            plVar3[iVar7] = uVar13;
            uVar8 = puVar1[(long)iVar9 + 0x13];
            if ((uVar8 & 0xff) < 0xc0) {
              uVar13 = (ulong)((uVar8 & 0xff) << 8) |
                       CONCAT44(uVar8,uVar8 << 0x10) & 0xffff0000ff000000;
            }
            else {
              uVar13 = (ulong)(uVar8 & 0xffffff00);
              if ((uVar8 & 0xf) == 1) {
                uVar13 = uVar13 << 0x20 | 0x5000500;
              }
            }
            plVar3[(long)iVar7 + 1] = uVar13;
            this_00->length = iVar7 + 2;
            if (iVar12 != 0) {
              uVar8 = puVar1[(long)iVar12 + 0x27];
              if ((uVar8 & 0xff) < 0xc0) {
                uVar13 = (ulong)((uVar8 & 0xff) << 8) |
                         CONCAT44(uVar8,uVar8 << 0x10) & 0xffff0000ff000000;
              }
              else {
                uVar13 = (ulong)(uVar8 & 0xffffff00);
                if ((uVar8 & 0xf) == 1) {
                  uVar13 = uVar13 << 0x20 | 0x5000500;
                }
              }
              this_00->length = iVar7 + 3;
              plVar3[iVar7 + 2] = uVar13;
            }
          }
        }
        uVar8 = ce32;
        if (bVar14) {
          return;
        }
        break;
      case 0xd:
        uVar6 = (*(this->super_UObject)._vptr_UObject[9])(this);
        uVar8 = 0xffffffff;
        if ((uVar6 & 0xfc00) == 0xdc00) {
          c = c * 0x400 + (uVar6 & 0xffff) + 0xfca02400;
          if (((ce32 & 0x300) != 0) &&
             (((ce32 & 0x300) == 0x100 ||
              (uVar8 = CollationData::getCE32FromSupplementary(d,c), uVar8 == 0xc0)))) {
            d = d->base;
            uVar8 = CollationData::getCE32FromSupplementary(d,c);
          }
        }
        break;
      case 0xe:
        uVar8 = Collation::getThreeBytePrimaryForOffsetData(c,d->ces[ce32 >> 0xd]);
        goto LAB_00244959;
      case 0xf:
        if ((c & 0xfffff800U) == 0xd800) {
          iVar7 = (*(this->super_UObject)._vptr_UObject[0xb])(this);
          uVar8 = 0xfffd0505;
          if ((char)iVar7 != '\0') break;
        }
        uVar8 = Collation::unassignedPrimaryFromCodePoint(c);
LAB_00244959:
        uVar13 = (ulong)uVar8;
        if ((0x27 < (this->ceBuffer).length) &&
           (UVar5 = CEBuffer::ensureAppendCapacity(this_00,1,errorCode), UVar5 == '\0')) {
          return;
        }
LAB_00244ae6:
        uVar13 = uVar13 << 0x20 | 0x5000500;
LAB_00244af1:
        iVar7 = (this->ceBuffer).length;
        (this->ceBuffer).length = iVar7 + 1;
        (this->ceBuffer).buffer.ptr[iVar7] = uVar13;
        return;
      }
      ce32 = uVar8;
    } while ((~ce32 & 0xc0) == 0);
  }
  if (((this->ceBuffer).length < 0x28) ||
     (UVar5 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,1,errorCode), UVar5 != '\0')) {
    iVar7 = (this->ceBuffer).length;
    (this->ceBuffer).length = iVar7 + 1;
    (this->ceBuffer).buffer.ptr[iVar7] =
         (ulong)((ce32 & 0xff) << 8) | CONCAT44(ce32,ce32 << 0x10) & 0xffff0000ff000000;
  }
  return;
}

Assistant:

void
CollationIterator::appendCEsFromCE32(const CollationData *d, UChar32 c, uint32_t ce32,
                                     UBool forward, UErrorCode &errorCode) {
    while(Collation::isSpecialCE32(ce32)) {
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::FALLBACK_TAG:
        case Collation::RESERVED_TAG_3:
            if(U_SUCCESS(errorCode)) { errorCode = U_INTERNAL_PROGRAM_ERROR; }
            return;
        case Collation::LONG_PRIMARY_TAG:
            ceBuffer.append(Collation::ceFromLongPrimaryCE32(ce32), errorCode);
            return;
        case Collation::LONG_SECONDARY_TAG:
            ceBuffer.append(Collation::ceFromLongSecondaryCE32(ce32), errorCode);
            return;
        case Collation::LATIN_EXPANSION_TAG:
            if(ceBuffer.ensureAppendCapacity(2, errorCode)) {
                ceBuffer.set(ceBuffer.length, Collation::latinCE0FromCE32(ce32));
                ceBuffer.set(ceBuffer.length + 1, Collation::latinCE1FromCE32(ce32));
                ceBuffer.length += 2;
            }
            return;
        case Collation::EXPANSION32_TAG: {
            const uint32_t *ce32s = d->ce32s + Collation::indexFromCE32(ce32);
            int32_t length = Collation::lengthFromCE32(ce32);
            if(ceBuffer.ensureAppendCapacity(length, errorCode)) {
                do {
                    ceBuffer.appendUnsafe(Collation::ceFromCE32(*ce32s++));
                } while(--length > 0);
            }
            return;
        }
        case Collation::EXPANSION_TAG: {
            const int64_t *ces = d->ces + Collation::indexFromCE32(ce32);
            int32_t length = Collation::lengthFromCE32(ce32);
            if(ceBuffer.ensureAppendCapacity(length, errorCode)) {
                do {
                    ceBuffer.appendUnsafe(*ces++);
                } while(--length > 0);
            }
            return;
        }
        case Collation::BUILDER_DATA_TAG:
            ce32 = getCE32FromBuilderData(ce32, errorCode);
            if(U_FAILURE(errorCode)) { return; }
            if(ce32 == Collation::FALLBACK_CE32) {
                d = data->base;
                ce32 = d->getCE32(c);
            }
            break;
        case Collation::PREFIX_TAG:
            if(forward) { backwardNumCodePoints(1, errorCode); }
            ce32 = getCE32FromPrefix(d, ce32, errorCode);
            if(forward) { forwardNumCodePoints(1, errorCode); }
            break;
        case Collation::CONTRACTION_TAG: {
            const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
            uint32_t defaultCE32 = CollationData::readCE32(p);  // Default if no suffix match.
            if(!forward) {
                // Backward contractions are handled by previousCEUnsafe().
                // c has contractions but they were not found.
                ce32 = defaultCE32;
                break;
            }
            UChar32 nextCp;
            if(skipped == NULL && numCpFwd < 0) {
                // Some portion of nextCE32FromContraction() pulled out here as an ASCII fast path,
                // avoiding the function call and the nextSkippedCodePoint() overhead.
                nextCp = nextCodePoint(errorCode);
                if(nextCp < 0) {
                    // No more text.
                    ce32 = defaultCE32;
                    break;
                } else if((ce32 & Collation::CONTRACT_NEXT_CCC) != 0 &&
                        !CollationFCD::mayHaveLccc(nextCp)) {
                    // All contraction suffixes start with characters with lccc!=0
                    // but the next code point has lccc==0.
                    backwardNumCodePoints(1, errorCode);
                    ce32 = defaultCE32;
                    break;
                }
            } else {
                nextCp = nextSkippedCodePoint(errorCode);
                if(nextCp < 0) {
                    // No more text.
                    ce32 = defaultCE32;
                    break;
                } else if((ce32 & Collation::CONTRACT_NEXT_CCC) != 0 &&
                        !CollationFCD::mayHaveLccc(nextCp)) {
                    // All contraction suffixes start with characters with lccc!=0
                    // but the next code point has lccc==0.
                    backwardNumSkipped(1, errorCode);
                    ce32 = defaultCE32;
                    break;
                }
            }
            ce32 = nextCE32FromContraction(d, ce32, p + 2, defaultCE32, nextCp, errorCode);
            if(ce32 == Collation::NO_CE32) {
                // CEs from a discontiguous contraction plus the skipped combining marks
                // have been appended already.
                return;
            }
            break;
        }
        case Collation::DIGIT_TAG:
            if(isNumeric) {
                appendNumericCEs(ce32, forward, errorCode);
                return;
            } else {
                // Fetch the non-numeric-collation CE32 and continue.
                ce32 = d->ce32s[Collation::indexFromCE32(ce32)];
                break;
            }
        case Collation::U0000_TAG:
            U_ASSERT(c == 0);
            if(forward && foundNULTerminator()) {
                // Handle NUL-termination. (Not needed in Java.)
                ceBuffer.append(Collation::NO_CE, errorCode);
                return;
            } else {
                // Fetch the normal ce32 for U+0000 and continue.
                ce32 = d->ce32s[0];
                break;
            }
        case Collation::HANGUL_TAG: {
            const uint32_t *jamoCE32s = d->jamoCE32s;
            c -= Hangul::HANGUL_BASE;
            UChar32 t = c % Hangul::JAMO_T_COUNT;
            c /= Hangul::JAMO_T_COUNT;
            UChar32 v = c % Hangul::JAMO_V_COUNT;
            c /= Hangul::JAMO_V_COUNT;
            if((ce32 & Collation::HANGUL_NO_SPECIAL_JAMO) != 0) {
                // None of the Jamo CE32s are isSpecialCE32().
                // Avoid recursive function calls and per-Jamo tests.
                if(ceBuffer.ensureAppendCapacity(t == 0 ? 2 : 3, errorCode)) {
                    ceBuffer.set(ceBuffer.length, Collation::ceFromCE32(jamoCE32s[c]));
                    ceBuffer.set(ceBuffer.length + 1, Collation::ceFromCE32(jamoCE32s[19 + v]));
                    ceBuffer.length += 2;
                    if(t != 0) {
                        ceBuffer.appendUnsafe(Collation::ceFromCE32(jamoCE32s[39 + t]));
                    }
                }
                return;
            } else {
                // We should not need to compute each Jamo code point.
                // In particular, there should be no offset or implicit ce32.
                appendCEsFromCE32(d, U_SENTINEL, jamoCE32s[c], forward, errorCode);
                appendCEsFromCE32(d, U_SENTINEL, jamoCE32s[19 + v], forward, errorCode);
                if(t == 0) { return; }
                // offset 39 = 19 + 21 - 1:
                // 19 = JAMO_L_COUNT
                // 21 = JAMO_T_COUNT
                // -1 = omit t==0
                ce32 = jamoCE32s[39 + t];
                c = U_SENTINEL;
                break;
            }
        }
        case Collation::LEAD_SURROGATE_TAG: {
            U_ASSERT(forward);  // Backward iteration should never see lead surrogate code _unit_ data.
            U_ASSERT(U16_IS_LEAD(c));
            UChar trail;
            if(U16_IS_TRAIL(trail = handleGetTrailSurrogate())) {
                c = U16_GET_SUPPLEMENTARY(c, trail);
                ce32 &= Collation::LEAD_TYPE_MASK;
                if(ce32 == Collation::LEAD_ALL_UNASSIGNED) {
                    ce32 = Collation::UNASSIGNED_CE32;  // unassigned-implicit
                } else if(ce32 == Collation::LEAD_ALL_FALLBACK ||
                        (ce32 = d->getCE32FromSupplementary(c)) == Collation::FALLBACK_CE32) {
                    // fall back to the base data
                    d = d->base;
                    ce32 = d->getCE32FromSupplementary(c);
                }
            } else {
                // c is an unpaired surrogate.
                ce32 = Collation::UNASSIGNED_CE32;
            }
            break;
        }
        case Collation::OFFSET_TAG:
            U_ASSERT(c >= 0);
            ceBuffer.append(d->getCEFromOffsetCE32(c, ce32), errorCode);
            return;
        case Collation::IMPLICIT_TAG:
            U_ASSERT(c >= 0);
            if(U_IS_SURROGATE(c) && forbidSurrogateCodePoints()) {
                ce32 = Collation::FFFD_CE32;
                break;
            } else {
                ceBuffer.append(Collation::unassignedCEFromCodePoint(c), errorCode);
                return;
            }
        }
    }
    ceBuffer.append(Collation::ceFromSimpleCE32(ce32), errorCode);
}